

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int Dau_DsdCountAnds_rec(char *pStr,char **p,int *pMatches)

{
  int iVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  
  pbVar7 = (byte *)*p;
  bVar3 = *pbVar7;
  pbVar2 = pbVar7;
  if (bVar3 == 0x21) {
    pbVar2 = pbVar7 + 1;
    *p = (char *)pbVar2;
    bVar3 = pbVar7[1];
  }
  if ((byte)(bVar3 + 0xbf) < 6 || (byte)(bVar3 - 0x30) < 10) {
    do {
      pbVar2 = pbVar2 + 1;
      *p = (char *)pbVar2;
      bVar3 = *pbVar2;
    } while ((byte)(bVar3 - 0x30) < 10 || (byte)(bVar3 + 0xbf) < 6);
  }
  if (bVar3 == 0x3c) {
    bVar3 = 0x3c;
    if (pStr[(long)pMatches[(long)pbVar2 - (long)pStr] + 1] != '{') goto LAB_0049b8ce;
    pbVar2 = (byte *)(pStr + (long)pMatches[(long)pbVar2 - (long)pStr] + 1);
    *p = (char *)pbVar2;
    bVar3 = *pbVar2;
  }
  if ((byte)(bVar3 + 0x9f) < 0x1a) {
    return 0;
  }
  uVar4 = (uint)bVar3;
  if (uVar4 < 0x5b) {
    if (uVar4 == 0x28) {
LAB_0049b861:
      if (uVar4 + (bVar3 != 0x28) + 1 != (int)pStr[pMatches[(long)pbVar2 - (long)pStr]]) {
        __assert_fail("*q == **p + 1 + (**p != \'(\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x129,"int Dau_DsdCountAnds_rec(char *, char **, int *)");
      }
      iVar6 = (uint)(bVar3 != 0x28) * 2 + 1;
      pbVar7 = (byte *)(pStr + pMatches[(long)pbVar2 - (long)pStr]);
      pbVar2 = pbVar2 + 1;
      *p = (char *)pbVar2;
      iVar5 = 0;
      if (pbVar2 < pbVar7) {
        iVar5 = 0;
        do {
          iVar1 = Dau_DsdCountAnds_rec(pStr,p,pMatches);
          iVar5 = iVar5 + iVar6 + iVar1;
          pbVar2 = (byte *)(*p + 1);
          *p = (char *)pbVar2;
        } while (pbVar2 < pbVar7);
      }
      if (pbVar2 == pbVar7) {
        return iVar5 - iVar6;
      }
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,300,"int Dau_DsdCountAnds_rec(char *, char **, int *)");
    }
    if (uVar4 != 0x3c) {
LAB_0049b9a7:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x139,"int Dau_DsdCountAnds_rec(char *, char **, int *)");
    }
  }
  else if (uVar4 != 0x7b) {
    if (uVar4 != 0x5b) goto LAB_0049b9a7;
    goto LAB_0049b861;
  }
LAB_0049b8ce:
  iVar5 = pMatches[(long)pbVar2 - (long)pStr];
  if (bVar3 + 2 != (int)pStr[iVar5]) {
    __assert_fail("*q == **p + 1 + (**p != \'(\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                  ,0x133,"int Dau_DsdCountAnds_rec(char *, char **, int *)");
  }
  pbVar2 = pbVar2 + 1;
  *p = (char *)pbVar2;
  iVar6 = 3;
  while (pbVar2 < pStr + iVar5) {
    iVar1 = Dau_DsdCountAnds_rec(pStr,p,pMatches);
    iVar6 = iVar6 + iVar1;
    pbVar2 = (byte *)(*p + 1);
    *p = (char *)pbVar2;
  }
  if (pbVar2 == (byte *)(pStr + iVar5)) {
    return iVar6;
  }
  __assert_fail("*p == q",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                ,0x136,"int Dau_DsdCountAnds_rec(char *, char **, int *)");
}

Assistant:

int Dau_DsdCountAnds_rec( char * pStr, char ** p, int * pMatches )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[*p - pStr];
        if ( *(q+1) == '{' )
            *p = q+1;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return 0;
    if ( **p == '(' || **p == '[' ) // and/or/xor
    {
        int Counter = 0, AddOn = (**p == '(')? 1 : 3;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
            Counter += AddOn + Dau_DsdCountAnds_rec( pStr, p, pMatches );
        assert( *p == q );
        return Counter - AddOn;
    }
    if ( **p == '<' || **p == '{' ) // mux
    {
        int Counter = 3;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
            Counter += Dau_DsdCountAnds_rec( pStr, p, pMatches );
        assert( *p == q );
        return Counter;
    }
    assert( 0 );
    return 0;
}